

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arbitrary.cpp
# Opt level: O2

void __thiscall
ArbitraryArbitrary_Arithmetic_IntCast::~ArbitraryArbitrary_Arithmetic_IntCast
          (ArbitraryArbitrary_Arithmetic_IntCast *this)

{
  testinator::Test::~Test(&this->super_Test);
  operator_delete(this,0x40);
  return;
}

Assistant:

DEF_TEST(Arbitrary_Arithmetic_IntCast, Arbitrary)
{
  testinator::Arbitrary<signed char> a;
  signed char v = a.generate(0,0);
  v = a.generate(1,0);
  v = a.generate(2,0);
  v = a.generate(3,0);
  a.shrink(v);
  return true;
}